

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O2

bool __thiscall LEFReader::parseRect(LEFReader *this)

{
  string *tokstr;
  token_t tVar1;
  int iVar2;
  bool bVar3;
  allocator<char> local_69;
  string local_68;
  string coords;
  
  coords._M_dataplus._M_p = (pointer)&coords.field_2;
  coords._M_string_length = 0;
  coords.field_2._M_local_buf[0] = '\0';
  tokstr = &this->m_tokstr;
  iVar2 = 4;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    tVar1 = tokenize(this,tokstr);
    this->m_curtok = tVar1;
    if (tVar1 != TOK_NUMBER) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Expected number in RECT\n",&local_69);
      error(this,&local_68);
      goto LAB_0012741f;
    }
    std::__cxx11::string::append((string *)&coords);
    std::__cxx11::string::append((char *)&coords);
  }
  tVar1 = tokenize(this,tokstr);
  this->m_curtok = tVar1;
  if (tVar1 == TOK_SEMICOL) {
    tVar1 = tokenize(this,tokstr);
    this->m_curtok = tVar1;
    bVar3 = true;
    if (tVar1 == TOK_EOL) goto LAB_0012742b;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Expected an EOL in RECT\n",&local_69);
    error(this,&local_68);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Expected a semicolon in RECT\n",&local_69);
    error(this,&local_68);
  }
LAB_0012741f:
  std::__cxx11::string::~string((string *)&local_68);
  bVar3 = false;
LAB_0012742b:
  std::__cxx11::string::~string((string *)&coords);
  return bVar3;
}

Assistant:

bool LEFReader::parseRect()
{
    
    std::string coords;

    for(uint32_t i=0; i<4; i++)
    {
        m_curtok = tokenize(m_tokstr);
        if (m_curtok != TOK_NUMBER)
        {
            error("Expected number in RECT\n");
            return false;
        }
        coords += m_tokstr;
        coords += " ";
    }

    // expect ; 
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a semicolon in RECT\n");
        return false;
    }

    // expect EOL
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected an EOL in RECT\n");
        return false;
    }    

    //std::cout << "      RECT " << coords << "\n";

    return true;
}